

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

void png_app_warning(png_const_structrp png_ptr,png_const_charp error_message)

{
  png_const_charp error_message_local;
  png_const_structrp png_ptr_local;
  
  if ((png_ptr->flags & 0x200000) != 0) {
    png_warning(png_ptr,error_message);
    return;
  }
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_app_warning(png_const_structrp png_ptr, png_const_charp error_message)
{
   if ((png_ptr->flags & PNG_FLAG_APP_WARNINGS_WARN) != 0)
      png_warning(png_ptr, error_message);
   else
      png_error(png_ptr, error_message);

#  ifndef PNG_ERROR_TEXT_SUPPORTED
      PNG_UNUSED(error_message)
#  endif
}